

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdParseDescriptor(void *handle,char *descriptor,int network_type,char *bip32_derivation_path,
                      void **descriptor_handle,uint32_t *max_index)

{
  __normal_iterator<cfd::DescriptorScriptData_*,_std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>_>
  __last;
  __normal_iterator<cfd::DescriptorKeyData_*,_std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>_>
  __last_00;
  bool bVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  void *pvVar4;
  size_type sVar5;
  char *in_RCX;
  char *in_RSI;
  undefined8 *in_R8;
  int *in_R9;
  CfdException *except;
  exception *std_except;
  ElementsAddressFactory factory_1;
  AddressFactory factory;
  DescriptorScriptData desc_data;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> multisig_key_list;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> script_list;
  string derive_path;
  NetType net_type;
  bool is_bitcoin;
  CfdCapiOutputDescriptor *buffer;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *in_stack_00001808;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *in_stack_00001810;
  string *in_stack_00001818;
  string *in_stack_00001820;
  AddressFactory *in_stack_00001828;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_00001840;
  undefined8 in_stack_fffffffffffff348;
  NetType type;
  DescriptorScriptData *this;
  DescriptorScriptData *in_stack_fffffffffffff350;
  value_type *in_stack_fffffffffffff358;
  string *in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff368;
  CfdError in_stack_fffffffffffff36c;
  __normal_iterator<cfd::DescriptorScriptData_*,_std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>_>
  in_stack_fffffffffffff370;
  __normal_iterator<cfd::DescriptorKeyData_*,_std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>_>
  __first;
  DescriptorScriptData *in_stack_fffffffffffff380;
  undefined8 in_stack_fffffffffffff388;
  NetType type_00;
  ElementsAddressFactory *in_stack_fffffffffffff390;
  bool *in_stack_fffffffffffff3a8;
  undefined8 in_stack_fffffffffffff3b0;
  int network_type_00;
  undefined8 in_stack_fffffffffffff408;
  uint32_t size;
  string *in_stack_fffffffffffff410;
  allocator *paVar6;
  allocator local_bb1;
  string local_bb0 [39];
  allocator local_b89;
  string local_b88 [903];
  allocator local_801;
  string local_800 [1720];
  undefined1 local_148 [55];
  allocator local_111;
  string local_110 [32];
  string local_f0 [32];
  NetType local_d0;
  byte local_cb;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  void *local_40;
  int *local_38;
  undefined8 *local_30;
  char *local_28;
  char *local_18;
  int local_4;
  
  size = (uint32_t)((ulong)in_stack_fffffffffffff408 >> 0x20);
  type_00 = (NetType)((ulong)in_stack_fffffffffffff388 >> 0x20);
  type = (NetType)((ulong)in_stack_fffffffffffff348 >> 0x20);
  network_type_00 = (int)((ulong)in_stack_fffffffffffff3b0 >> 0x20);
  local_40 = (void *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_30 == (undefined8 *)0x0) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x1a0;
    local_68.funcname = "CfdParseDescriptor";
    cfd::core::logger::warn<>(&local_68,"descriptor handle is null.");
    local_8a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar6 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to parameter. descriptor handle is null.",paVar6);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff370._M_current,in_stack_fffffffffffff36c,
               in_stack_fffffffffffff360);
    local_8a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_18 != (char *)0x0) {
    local_cb = 0;
    local_d0 = cfd::capi::ConvertNetType(network_type_00,in_stack_fffffffffffff3a8);
    std::__cxx11::string::string(local_f0);
    if ((local_28 != (char *)0x0) && (*local_28 != '\0')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,local_28,&local_111);
      std::__cxx11::string::operator=(local_f0,local_110);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::vector
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
               0x580b59);
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::vector
              ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x580b66);
    cfd::DescriptorScriptData::DescriptorScriptData(in_stack_fffffffffffff380);
    if ((local_cb & 1) == 0) {
      cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff390,type_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b88,local_18,&local_b89);
      this = (DescriptorScriptData *)0x0;
      cfd::AddressFactory::ParseOutputDescriptor
                (in_stack_00001828,in_stack_00001820,in_stack_00001818,in_stack_00001810,
                 in_stack_00001808,in_stack_00001840);
      cfd::DescriptorScriptData::operator=(in_stack_fffffffffffff350,this);
      cfd::DescriptorScriptData::~DescriptorScriptData(in_stack_fffffffffffff350);
      std::__cxx11::string::~string(local_b88);
      std::allocator<char>::~allocator((allocator<char> *)&local_b89);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x580df9);
    }
    else {
      cfd::AddressFactory::AddressFactory((AddressFactory *)in_stack_fffffffffffff350,type);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_800,local_18,&local_801);
      this = (DescriptorScriptData *)0x0;
      cfd::AddressFactory::ParseOutputDescriptor
                (in_stack_00001828,in_stack_00001820,in_stack_00001818,in_stack_00001810,
                 in_stack_00001808,in_stack_00001840);
      cfd::DescriptorScriptData::operator=(in_stack_fffffffffffff350,this);
      cfd::DescriptorScriptData::~DescriptorScriptData(in_stack_fffffffffffff350);
      std::__cxx11::string::~string(local_800);
      std::allocator<char>::~allocator((allocator<char> *)&local_801);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x580c69);
    }
    bVar1 = std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
            empty((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                  in_stack_fffffffffffff360);
    if (bVar1) {
      std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::push_back
                ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                 in_stack_fffffffffffff360,in_stack_fffffffffffff358);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_bb0,"Descriptor",&local_bb1);
    local_40 = cfd::capi::AllocBuffer(in_stack_fffffffffffff410,size);
    std::__cxx11::string::~string(local_bb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::vector
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
               0x580f36);
    *(undefined8 **)((long)local_40 + 0x18) = puVar3;
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::vector
              ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x580f70);
    *(undefined8 **)((long)local_40 + 0x20) = puVar3;
    pvVar4 = operator_new(0x18);
    std::allocator<cfd::DescriptorScriptData>::allocator
              ((allocator<cfd::DescriptorScriptData> *)0x580fac);
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::vector
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
               in_stack_fffffffffffff370._M_current,
               CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
               (allocator_type *)in_stack_fffffffffffff360);
    *(void **)((long)local_40 + 0x10) = pvVar4;
    std::allocator<cfd::DescriptorScriptData>::~allocator
              ((allocator<cfd::DescriptorScriptData> *)0x580fe8);
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::begin
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)this
              );
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::end
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)this
              );
    __last._M_current._4_4_ = in_stack_fffffffffffff36c;
    __last._M_current._0_4_ = in_stack_fffffffffffff368;
    std::vector<cfd::DescriptorScriptData,std::allocator<cfd::DescriptorScriptData>>::
    assign<__gnu_cxx::__normal_iterator<cfd::DescriptorScriptData*,std::vector<cfd::DescriptorScriptData,std::allocator<cfd::DescriptorScriptData>>>,void>
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
               in_stack_fffffffffffff360,in_stack_fffffffffffff370,__last);
    __first._M_current = (DescriptorKeyData *)local_148;
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::begin
              ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)this);
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::end
              ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)this);
    __last_00._M_current._4_4_ = in_stack_fffffffffffff36c;
    __last_00._M_current._0_4_ = in_stack_fffffffffffff368;
    std::vector<cfd::DescriptorKeyData,std::allocator<cfd::DescriptorKeyData>>::
    assign<__gnu_cxx::__normal_iterator<cfd::DescriptorKeyData*,std::vector<cfd::DescriptorKeyData,std::allocator<cfd::DescriptorKeyData>>>,void>
              ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)
               in_stack_fffffffffffff360,__first,__last_00);
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::operator[]
              (*(vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> **)
                ((long)local_40 + 0x10),0);
    cfd::DescriptorScriptData::operator=(in_stack_fffffffffffff350,this);
    if (local_38 != (int *)0x0) {
      sVar5 = std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
              size((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                   (local_148 + 0x18));
      *local_38 = (int)sVar5 + -1;
    }
    *local_30 = local_40;
    local_4 = 0;
    cfd::DescriptorScriptData::~DescriptorScriptData(in_stack_fffffffffffff350);
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::~vector
              ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)
               in_stack_fffffffffffff360);
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::~vector
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
               in_stack_fffffffffffff360);
    std::__cxx11::string::~string(local_f0);
    return local_4;
  }
  local_a8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
               ,0x2f);
  local_a8.filename = local_a8.filename + 1;
  local_a8.line = 0x1a6;
  local_a8.funcname = "CfdParseDescriptor";
  cfd::core::logger::warn<>(&local_a8,"descriptor is null.");
  local_ca = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"Failed to parameter. descriptor is null.",&local_c9);
  cfd::core::CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffff370._M_current,in_stack_fffffffffffff36c,
             in_stack_fffffffffffff360);
  local_ca = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdParseDescriptor(
    void* handle, const char* descriptor, int network_type,
    const char* bip32_derivation_path, void** descriptor_handle,
    uint32_t* max_index) {
  CfdCapiOutputDescriptor* buffer = nullptr;
  try {
    cfd::Initialize();
    if (descriptor_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "descriptor handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor handle is null.");
    }
    if (descriptor == nullptr) {
      warn(CFD_LOG_SOURCE, "descriptor is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    std::string derive_path;
    if ((bip32_derivation_path != nullptr) &&
        (*bip32_derivation_path != '\0')) {
      derive_path = std::string(bip32_derivation_path);
    }

    std::vector<DescriptorScriptData> script_list;
    std::vector<DescriptorKeyData> multisig_key_list;
    DescriptorScriptData desc_data;
    if (is_bitcoin) {
      AddressFactory factory(net_type);
      desc_data = factory.ParseOutputDescriptor(
          descriptor, derive_path, &script_list, &multisig_key_list);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      desc_data = factory.ParseOutputDescriptor(
          descriptor, derive_path, &script_list, &multisig_key_list);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (script_list.empty()) {
      script_list.push_back(desc_data);
    }

    buffer = static_cast<CfdCapiOutputDescriptor*>(
        AllocBuffer(kPrefixOutputDescriptor, sizeof(CfdCapiOutputDescriptor)));
    buffer->script_list = new std::vector<DescriptorScriptData>();
    buffer->multisig_key_list = new std::vector<DescriptorKeyData>();
    buffer->script_root = new std::vector<DescriptorScriptData>(1);
    buffer->script_list->assign(script_list.begin(), script_list.end());
    // *(buffer->script_list) = script_list;
    buffer->multisig_key_list->assign(
        multisig_key_list.begin(), multisig_key_list.end());
    // *(buffer->multisig_key_list) = multisig_key_list;
    (*buffer->script_root)[0] = desc_data;
    if (max_index != nullptr) {
      *max_index = static_cast<uint32_t>(script_list.size() - 1);
    }
    *descriptor_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    if (buffer != nullptr) CfdFreeDescriptorHandle(handle, buffer);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    if (buffer != nullptr) CfdFreeDescriptorHandle(handle, buffer);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    if (buffer != nullptr) CfdFreeDescriptorHandle(handle, buffer);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}